

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ErrorList.cpp
# Opt level: O2

void __thiscall
amrex::ErrorRec::ErrorFunc::operator()
          (ErrorFunc *this,int *tag,int *tlo,int *thi,int *tagval,int *clearval,Real *data,int *dlo,
          int *dhi,int *lo,int *hi,int *nvar,int *domain_lo,int *domain_hi,Real *dx,Real *xlo,
          Real *prob_lo,Real *time,int *level)

{
  (*this->m_func3D)(tag,tlo,thi,tagval,clearval,data,dlo,dhi,lo,hi,nvar,domain_lo,domain_hi,dx,xlo,
                    prob_lo,time,level);
  return;
}

Assistant:

void
ErrorRec::ErrorFunc::operator () (int* tag, const int* tlo, const int* thi,
                                  const int* tagval, const int* clearval,
                                  Real* data, const int* dlo, const int* dhi,
                                  const int* lo, const int * hi, const int* nvar,
                                  const int* domain_lo, const int* domain_hi,
                                  const Real* dx, const Real* xlo,
                                  const Real* prob_lo, const Real* time,
                                  const int* level) const
{
    BL_ASSERT(m_func3D != 0);

    m_func3D(tag,AMREX_ARLIM_3D(tlo),AMREX_ARLIM_3D(thi),
             tagval,clearval,data,AMREX_ARLIM_3D(dlo),AMREX_ARLIM_3D(dhi),
             AMREX_ARLIM_3D(lo),AMREX_ARLIM_3D(hi),nvar,
             AMREX_ARLIM_3D(domain_lo),AMREX_ARLIM_3D(domain_hi),
             AMREX_ZFILL(dx),AMREX_ZFILL(xlo),AMREX_ZFILL(prob_lo),time,level);
}